

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_object.c
# Opt level: O3

char * json_object_to_json_string_length(json_object *jso,int flags,size_t *length)

{
  int iVar1;
  printbuf *p;
  size_t sVar2;
  char *pcVar3;
  
  if (jso == (json_object *)0x0) {
    sVar2 = 4;
    pcVar3 = "null";
    goto LAB_00105219;
  }
  p = jso->_pb;
  if (p == (printbuf *)0x0) {
    p = printbuf_new();
    jso->_pb = p;
    if (p != (printbuf *)0x0) goto LAB_001051de;
  }
  else {
LAB_001051de:
    printbuf_reset(p);
    iVar1 = (*jso->_to_json_string)(jso,jso->_pb,0,flags);
    if (-1 < iVar1) {
      sVar2 = (size_t)jso->_pb->bpos;
      pcVar3 = jso->_pb->buf;
      goto LAB_00105219;
    }
  }
  pcVar3 = (char *)0x0;
  sVar2 = 0;
LAB_00105219:
  if (length != (size_t *)0x0) {
    *length = sVar2;
  }
  return pcVar3;
}

Assistant:

const char *json_object_to_json_string_length(struct json_object *jso, int flags, size_t *length)
{
	const char *r = NULL;
	size_t s = 0;

	if (!jso)
	{
		s = 4;
		r = "null";
	}
	else if ((jso->_pb) || (jso->_pb = printbuf_new()))
	{
		printbuf_reset(jso->_pb);

		if (jso->_to_json_string(jso, jso->_pb, 0, flags) >= 0)
		{
			s = (size_t)jso->_pb->bpos;
			r = jso->_pb->buf;
		}
	}

	if (length)
		*length = s;
	return r;
}